

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

int flatcc_builder_truncate_string(flatcc_builder_t *B,size_t len)

{
  __flatcc_builder_frame_t *p_Var1;
  uint uVar2;
  
  p_Var1 = B->frame;
  if (p_Var1->type != 6) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x400,"int flatcc_builder_truncate_string(flatcc_builder_t *, size_t)");
  }
  uVar2 = (p_Var1->container).table.pl_end;
  if (len <= uVar2) {
    (p_Var1->container).table.pl_end = uVar2 - (int)len;
    uVar2 = B->ds_offset - (int)len;
    B->ds_offset = uVar2;
    memset(B->ds + uVar2,0,len);
    return 0;
  }
  __assert_fail("(B->frame[0].container.vector.count) >= len",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x401,"int flatcc_builder_truncate_string(flatcc_builder_t *, size_t)");
}

Assistant:

int flatcc_builder_truncate_string(flatcc_builder_t *B, size_t len)
{
    check(frame(type) == flatcc_builder_string, "expected string frame");
    check_error(frame(container.vector.count) >= len, -1, "cannot truncate string past empty");
    frame(container.vector.count) -= (uoffset_t)len;
    unpush_ds(B, (uoffset_t)len);
    return 0;
}